

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O2

void yprp_grouping(lys_ypr_ctx_conflict *pctx,lysp_node_grp *grp)

{
  uint16_t *puVar1;
  lysp_node_grp *grp_00;
  lysp_node *node;
  lysp_node_action *action;
  lysp_node_notif *notif;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  lysp_node_notif **pplVar5;
  lysp_node_grp **pplVar6;
  lysp_node **pplVar7;
  lysp_node_action **pplVar8;
  int8_t flag;
  int8_t local_29;
  
  local_29 = '\0';
  lVar3 = 0;
  ypr_open(pctx,"grouping","name",(grp->field_0).node.name,'\0');
  puVar1 = &(pctx->field_0).field_0.level;
  *puVar1 = *puVar1 + 1;
  yprp_extension_instances(pctx,LY_STMT_GROUPING,'\0',(grp->field_0).node.exts,&local_29);
  ypr_status(pctx,(grp->field_0).node.flags,(grp->field_0).node.exts,&local_29);
  ypr_description(pctx,(grp->field_0).node.dsc,(grp->field_0).node.exts,&local_29);
  ypr_reference(pctx,(grp->field_0).node.ref,(grp->field_0).node.exts,&local_29);
  uVar4 = 0;
  while( true ) {
    if (grp->typedefs == (lysp_tpdf *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = *(ulong *)&grp->typedefs[-1].flags;
    }
    if (uVar2 <= uVar4) break;
    ypr_close_parent(pctx,&local_29);
    yprp_typedef(pctx,(lysp_tpdf *)((long)&grp->typedefs->name + lVar3));
    uVar4 = uVar4 + 1;
    lVar3 = lVar3 + 0xb0;
  }
  pplVar6 = &grp->groupings;
  while (grp_00 = *pplVar6, grp_00 != (lysp_node_grp *)0x0) {
    ypr_close_parent(pctx,&local_29);
    yprp_grouping(pctx,grp_00);
    pplVar6 = &(grp_00->field_0).field_1.next;
  }
  pplVar7 = &grp->child;
  while (node = *pplVar7, node != (lysp_node *)0x0) {
    ypr_close_parent(pctx,&local_29);
    yprp_node(pctx,node);
    pplVar7 = &node->next;
  }
  pplVar8 = &grp->actions;
  while (action = *pplVar8, action != (lysp_node_action *)0x0) {
    ypr_close_parent(pctx,&local_29);
    yprp_action(pctx,action);
    pplVar8 = &(action->field_0).field_1.next;
  }
  pplVar5 = &grp->notifs;
  while (notif = *pplVar5, notif != (lysp_node_notif *)0x0) {
    ypr_close_parent(pctx,&local_29);
    yprp_notification(pctx,notif);
    pplVar5 = &(notif->field_0).field_1.next;
  }
  puVar1 = &(pctx->field_0).field_0.level;
  *puVar1 = *puVar1 - 1;
  ypr_close(pctx,"grouping",local_29);
  return;
}

Assistant:

static void
yprp_grouping(struct lys_ypr_ctx *pctx, const struct lysp_node_grp *grp)
{
    LY_ARRAY_COUNT_TYPE u;
    ly_bool flag = 0;
    struct lysp_node *data;
    struct lysp_node_action *action;
    struct lysp_node_notif *notif;
    struct lysp_node_grp *subgrp;

    ly_print_(pctx->out, "%*sgrouping %s", INDENT, grp->name);
    LEVEL++;

    yprp_extension_instances(pctx, LY_STMT_GROUPING, 0, grp->exts, &flag);
    ypr_status(pctx, grp->flags, grp->exts, &flag);
    ypr_description(pctx, grp->dsc, grp->exts, &flag);
    ypr_reference(pctx, grp->ref, grp->exts, &flag);

    LY_ARRAY_FOR(grp->typedefs, u) {
        ypr_open(pctx->out, &flag);
        yprp_typedef(pctx, &grp->typedefs[u]);
    }

    LY_LIST_FOR(grp->groupings, subgrp) {
        ypr_open(pctx->out, &flag);
        yprp_grouping(pctx, subgrp);
    }

    LY_LIST_FOR(grp->child, data) {
        ypr_open(pctx->out, &flag);
        yprp_node(pctx, data);
    }

    LY_LIST_FOR(grp->actions, action) {
        ypr_open(pctx->out, &flag);
        yprp_action(pctx, action);
    }

    LY_LIST_FOR(grp->notifs, notif) {
        ypr_open(pctx->out, &flag);
        yprp_notification(pctx, notif);
    }

    LEVEL--;
    ypr_close(pctx, flag);
}